

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_plain.c
# Opt level: O1

char * saslplain_get_mechanism_name(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  
  if (sasl_mechanism == (CONCRETE_SASL_MECHANISM_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = (char *)0x0;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_plain.c"
                ,"saslplain_get_mechanism_name",0xb4,1,"NULL sasl_mechanism");
    }
  }
  else {
    pcVar2 = "PLAIN";
  }
  return pcVar2;
}

Assistant:

const char* saslplain_get_mechanism_name(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism)
{
    const char* result;

    if (sasl_mechanism == NULL)
    {
        /* Codes_SRS_SASL_PLAIN_01_011: [If the argument `concrete_sasl_mechanism` is NULL, `saslplain_get_mechanism_name` shall return NULL.] */
        LogError("NULL sasl_mechanism");
        result = NULL;
    }
    else
    {
        /* Codes_SRS_SASL_PLAIN_01_010: [`saslplain_get_mechanism_name` shall validate the argument `concrete_sasl_mechanism` and on success it shall return a pointer to the string "PLAIN".] */
        result = "PLAIN";
    }

    return result;
}